

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  long lVar2;
  uint *puVar3;
  IStream *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  ArgExc *pAVar9;
  uint *puVar10;
  Array2D<unsigned_int> *sampleCountBuffer;
  long lVar11;
  int iVar12;
  long lVar13;
  stringstream _iex_replace_s;
  
  if (this->_data->frameBufferValid == false) {
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar9,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar9,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  iVar6 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  iVar5 = scanline1;
  if (scanline2 < scanline1) {
    iVar5 = scanline2;
  }
  if (this->_data->minY <= iVar5) {
    iVar7 = scanline2;
    if (scanline2 < scanline1) {
      iVar7 = scanline1;
    }
    if (iVar7 <= this->_data->maxY) {
      iVar7 = scanline1;
      if (scanline2 < scanline1) {
        iVar7 = scanline2;
      }
      lVar13 = (long)iVar7;
      do {
        pDVar1 = this->_data;
        if ((pDVar1->bigFile == false) &&
           (lVar8 = lVar13 - pDVar1->minY, (pDVar1->gotSampleCount)._data[lVar8] == true)) {
          iVar7 = pDVar1->minX;
          if (iVar7 <= pDVar1->maxX) {
            iVar12 = pDVar1->sampleCountXStride;
            lVar11 = (long)iVar7 + -1;
            puVar10 = (uint *)(pDVar1->sampleCountSliceBase +
                              (long)iVar7 * (long)iVar12 + pDVar1->sampleCountYStride * lVar13);
            lVar2 = (pDVar1->sampleCount)._sizeY;
            puVar3 = (pDVar1->sampleCount)._data;
            do {
              *puVar10 = puVar3[lVar8 * lVar2 + ((lVar11 + 1) - (long)pDVar1->minX)];
              lVar11 = lVar11 + 1;
              puVar10 = (uint *)((long)puVar10 + (long)iVar12);
            } while (lVar11 < pDVar1->maxX);
          }
        }
        else {
          iVar7 = ((int)lVar13 - pDVar1->minY) / pDVar1->linesInBuffer;
          sampleCountBuffer = &pDVar1->sampleCount;
          if (pDVar1->bigFile != false) {
            sampleCountBuffer = (Array2D<unsigned_int> *)0x0;
          }
          anon_unknown_0::readSampleCountForLineBlock
                    (pDVar1->_streamData,pDVar1,iVar7,sampleCountBuffer,pDVar1->minY,true);
          pDVar1 = this->_data;
          iVar12 = iVar7 * pDVar1->linesInBuffer + pDVar1->minY;
          iVar7 = pDVar1->linesInBuffer + iVar12 + -1;
          if (pDVar1->maxY < iVar7) {
            iVar7 = pDVar1->maxY;
          }
          bytesPerDeepLineTable
                    (&pDVar1->header,iVar12,iVar7,pDVar1->sampleCountSliceBase,
                     pDVar1->sampleCountXStride,pDVar1->sampleCountYStride,&pDVar1->bytesPerLine);
          pDVar1 = this->_data;
          offsetInLineBufferTable
                    (&pDVar1->bytesPerLine,iVar12 - pDVar1->minY,iVar7 - pDVar1->minY,
                     pDVar1->linesInBuffer,&pDVar1->offsetInLineBuffer);
        }
        lVar13 = lVar13 + 1;
      } while (((scanline1 + scanline2) - iVar5) + 1 != (int)lVar13);
      pIVar4 = this->_data->_streamData->is;
      (*pIVar4->_vptr_IStream[6])(pIVar4,CONCAT44(extraout_var,iVar6));
      pthread_mutex_unlock(__mutex);
      return;
    }
  }
  pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc
            (pAVar9,"Tried to read scan line sample counts outside the image file\'s data window.");
  __cxa_throw(pAVar9,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    uint64_t savedFilePos = 0;

    if (!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc (
            "readPixelSampleCounts called with no valid frame buffer");
    }

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        savedFilePos = _data->_streamData->is->tellg ();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc (
                "Tried to read scan line sample counts outside "
                "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, and file is small enough to cache, count data will be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (!_data->bigFile && _data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache (i, _data);
            }
            else
            {

                int lineBlockId = (i - _data->minY) / _data->linesInBuffer;

                //
                // read samplecount data into external buffer
                // also cache to internal buffer unless in bigFile mode
                //
                readSampleCountForLineBlock (
                    _data->_streamData,
                    _data,
                    lineBlockId,
                    _data->bigFile ? nullptr : &_data->sampleCount,
                    _data->minY,
                    true);

                int minYInLineBuffer =
                    lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min (
                    minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable (
                    _data->header,
                    minYInLineBuffer,
                    maxYInLineBuffer,
                    _data->sampleCountSliceBase,
                    _data->sampleCountXStride,
                    _data->sampleCountYStride,
                    _data->bytesPerLine);

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable (
                    _data->bytesPerLine,
                    minYInLineBuffer - _data->minY,
                    maxYInLineBuffer - _data->minY,
                    _data->linesInBuffer,
                    _data->offsetInLineBuffer);
            }
        }

        _data->_streamData->is->seekg (savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading sample count data from image "
            "file \""
                << fileName () << "\". " << e.what ());

        _data->_streamData->is->seekg (savedFilePos);

        throw;
    }
}